

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

int __thiscall ON_Brep::NextNonsingularTrim(ON_Brep *this,int tid)

{
  TYPE TVar1;
  int iVar2;
  ON_BrepTrim *pOVar3;
  bool bVar4;
  int local_24;
  int ntid;
  bool bSing;
  int tid_local;
  ON_Brep *this_local;
  
  iVar2 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  if ((tid < iVar2) && (-1 < tid)) {
    pOVar3 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,tid);
    TVar1 = pOVar3->m_type;
    local_24 = NextTrim(this,tid);
    do {
      bVar4 = false;
      if (-1 < local_24) {
        pOVar3 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_24);
        bVar4 = pOVar3->m_type == singular;
      }
      if (!bVar4) {
        return local_24;
      }
      local_24 = NextTrim(this,local_24);
    } while ((local_24 != tid) || (TVar1 != singular));
  }
  return -1;
}

Assistant:

int ON_Brep::NextNonsingularTrim(int tid) const

{
  if (tid >= m_T.Count() || tid < 0)
    return -1;
  bool bSing =  (m_T[tid].m_type == ON_BrepTrim::singular) ? true : false;
  int ntid;
  ntid = NextTrim(tid);
  while (ntid >=0 && m_T[ntid].m_type == ON_BrepTrim::singular){
    ntid = NextTrim(ntid);
    if (ntid == tid && bSing)
      return -1;
  }
  return ntid;
}